

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void dynamic_suite::test_null(void)

{
  bool v;
  type v_00;
  nullable local_1e4 [3];
  char *msg;
  undefined1 local_1c8 [8];
  variable value;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  undefined1 local_180 [8];
  iarchive in;
  char input [5];
  
  in.member.reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  in.member.reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x6c6c756e;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,
             (char *)((long)&in.member.reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl + 0x10));
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            ((basic_iarchive<char> *)local_180,&local_190);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  boost::archive::detail::interface_iarchive<trial::protocol::json::basic_iarchive<char>>::
  operator>>((interface_iarchive<trial::protocol::json::basic_iarchive<char>> *)local_180,
             (basic_variable<std::allocator<char>_> *)local_1c8);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                ((basic_variable<std::allocator<char>_> *)local_1c8);
  boost::detail::test_impl
            ("value.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2aa,"void dynamic_suite::test_null()",v);
  local_1e4[0] = null;
  v_00 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_1c8,local_1e4);
  boost::detail::test_impl
            ("value == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2ab,"void dynamic_suite::test_null()",v_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive((basic_iarchive<char> *)local_180);
  return;
}

Assistant:

void test_null()
{
    const char input[] = "null";
    json::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value.is<nullable>());
    TRIAL_PROTOCOL_TEST(value == null);
}